

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::(anonymous_namespace)::TeeBranch> __thiscall
kj::heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncTee> *params,int *params_1)

{
  uint uVar1;
  AsyncTee *pAVar2;
  undefined8 *puVar3;
  TeeBranch *extraout_RDX;
  long lVar4;
  long lVar5;
  char *pcVar6;
  Own<kj::(anonymous_namespace)::TeeBranch> OVar7;
  Own<kj::(anonymous_namespace)::AsyncTee> local_88;
  Fault f;
  
  puVar3 = (undefined8 *)operator_new(0x20);
  local_88.disposer = params->disposer;
  pAVar2 = params->ptr;
  params->ptr = (AsyncTee *)0x0;
  uVar1 = *params_1;
  *puVar3 = &PTR_read_00431a88;
  local_88.ptr = (AsyncTee *)0x0;
  puVar3[1] = local_88.disposer;
  puVar3[2] = pAVar2;
  *(char *)(puVar3 + 3) = (char)uVar1;
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)puVar3 + 0x1c));
  lVar5 = puVar3[2];
  lVar4 = (ulong)(uVar1 & 0xff) * 0x60;
  if (*(char *)(lVar5 + 0x38 + lVar4) != '\x01') {
    f.exception = (Exception *)0x0;
    std::_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
    _Deque_base((_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *
                )&f);
    lVar5 = lVar5 + lVar4;
    pcVar6 = (char *)(lVar5 + 0x38);
    if (*pcVar6 == '\x01') {
      *pcVar6 = '\0';
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
                ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
                 (lVar5 + 0x40));
    }
    std::_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
    _Deque_base((_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *
                )(lVar5 + 0x40),
                (_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *
                )&f);
    *(undefined8 *)(lVar5 + 0x90) = 0;
    *pcVar6 = '\x01';
    std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
              ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)&f);
    *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::TeeBranch>::instance;
    *(undefined8 **)(this + 8) = puVar3;
    Own<kj::(anonymous_namespace)::AsyncTee>::~Own(&local_88);
    OVar7.ptr = extraout_RDX;
    OVar7.disposer = (Disposer *)this;
    return OVar7;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x4c1,FAILED,"branches[branch] == nullptr","\"branch already exists\"",
             (char (*) [22])"branch already exists");
  _::Debug::Fault::fatal(&f);
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}